

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O1

void __thiscall
deqp::gles31::Functional::anon_unknown_0::SeparateShaderTest::testPipelineRendering
          (SeparateShaderTest *this,
          MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
          *pipeOut)

{
  CallLogWrapper *this_00;
  ostringstream *poVar1;
  GLuint pipeline;
  Pipeline *pPVar2;
  undefined8 uVar3;
  bool condition;
  GLuint program;
  deUint32 seed;
  Surface pipelineSurface;
  Surface refSurface;
  ProgramParams pp;
  Surface local_1f0;
  Surface local_1d8;
  ProgramParams local_1c0;
  undefined1 local_1b0 [16];
  Pipeline local_1a0;
  ios_base local_138 [264];
  
  local_1c0 = genProgramParams(&this->m_rnd);
  createPipeline((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
                  *)local_1b0,this,&local_1c0);
  uVar3 = local_1b0._0_8_;
  local_1b0._0_8_ = (Pipeline *)0x0;
  if ((pipeOut->
      super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
      ).m_data.ptr != (Pipeline *)uVar3) {
    de::details::
    UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
    ::reset(&pipeOut->
             super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           );
    (pipeOut->
    super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
    ).m_data.ptr = (Pipeline *)uVar3;
  }
  pPVar2 = (pipeOut->
           super_UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           ).m_data.ptr;
  de::details::
  UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
  ::reset((UniqueBase<deqp::gles31::Functional::(anonymous_namespace)::Pipeline,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::Pipeline>_>
           *)local_1b0);
  pipeline = *(GLuint *)
              ((long)(pPVar2->pipeline).
                     super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                     .m_data.ptr + 8);
  createReferenceProgram
            ((MovePtr<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper,_de::DefaultDeleter<deqp::gles31::Functional::(anonymous_namespace)::ProgramWrapper>_>
              *)local_1b0,this,&local_1c0);
  uVar3 = local_1b0._0_8_;
  program = (**(code **)(*(long *)local_1b0._0_8_ + 0x10))(local_1b0._0_8_);
  tcu::Surface::Surface(&local_1d8);
  tcu::Surface::Surface(&local_1f0);
  seed = deRandom_getUint32(&(this->m_rnd).m_rnd);
  this_00 = &this->super_CallLogWrapper;
  glu::CallLogWrapper::glUseProgram(this_00,program);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// Use program ",0xf);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  drawSurface(this,&local_1d8,seed);
  glu::CallLogWrapper::glUseProgram(this_00,0);
  glu::CallLogWrapper::glBindProgramPipeline(this_00,pipeline);
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"// Bind pipeline ",0x11);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_138);
  drawSurface(this,&local_1f0,seed);
  glu::CallLogWrapper::glBindProgramPipeline(this_00,0);
  condition = tcu::fuzzyCompare(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                                m_log,"Program pipeline result",
                                "Result of comparing a program pipeline with a monolithic program",
                                &local_1d8,&local_1f0,0.05,COMPARE_LOG_RESULT);
  local_1b0._0_8_ = &local_1a0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b0,"Pipeline rendering differs from equivalent monolithic program","")
  ;
  tcu::ResultCollector::check(&this->m_status,condition,(string *)local_1b0);
  if ((Pipeline *)local_1b0._0_8_ != &local_1a0) {
    operator_delete((void *)local_1b0._0_8_,
                    (ulong)((long)local_1a0.pipeline.
                                  super_UniqueBase<glu::ProgramPipeline,_de::DefaultDeleter<glu::ProgramPipeline>_>
                                  .m_data.ptr + 1));
  }
  tcu::Surface::~Surface(&local_1f0);
  tcu::Surface::~Surface(&local_1d8);
  (**(code **)(*(long *)uVar3 + 8))(uVar3);
  return;
}

Assistant:

void SeparateShaderTest::testPipelineRendering (MovePtr<Pipeline>& pipeOut)
{
	ProgramParams				pp			= genProgramParams(m_rnd);
	Pipeline&					pipeline	= *(pipeOut = createPipeline(pp));
	GLuint						pipeName	= pipeline.pipeline->getPipeline();
	UniquePtr<ProgramWrapper>	refProgram	(createReferenceProgram(pp));
	GLuint						refProgName	= refProgram->getProgramName();
	Surface						refSurface;
	Surface						pipelineSurface;
	GLuint						drawSeed	= m_rnd.getUint32();

	glUseProgram(refProgName);
	log() << TestLog::Message << "// Use program " << refProgName << TestLog::EndMessage;
	drawSurface(refSurface, drawSeed);
	glUseProgram(0);

	glBindProgramPipeline(pipeName);
	log() << TestLog::Message << "// Bind pipeline " << pipeName << TestLog::EndMessage;
	drawSurface(pipelineSurface, drawSeed);
	glBindProgramPipeline(0);

	{
		const bool result = tcu::fuzzyCompare(
			m_testCtx.getLog(), "Program pipeline result",
			"Result of comparing a program pipeline with a monolithic program",
			refSurface, pipelineSurface, 0.05f, tcu::COMPARE_LOG_RESULT);

		m_status.check(result, "Pipeline rendering differs from equivalent monolithic program");
	}
}